

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::erase
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos)

{
  pointer pCVar1;
  size_type sVar2;
  const_iterator this_00;
  long lVar3;
  ulong uVar4;
  
  pCVar1 = this->data_;
  sVar2 = this->len;
  lVar3 = (long)((long)pCVar1 + (sVar2 * 8 - (long)pos) + -8) >> 3;
  if (0 < lVar3) {
    uVar4 = lVar3 + 1;
    this_00 = pos;
    do {
      anon_unknown.dwarf_d691dd::Constructable::operator=(this_00,this_00 + 1);
      uVar4 = uVar4 - 1;
      this_00 = this_00 + 1;
    } while (1 < uVar4);
    pCVar1 = this->data_;
    sVar2 = this->len;
  }
  this->len = sVar2 - 1;
  anon_unknown.dwarf_d691dd::Constructable::~Constructable(pCVar1 + (sVar2 - 1));
  return pos;
}

Assistant:

iterator erase(const_iterator pos) {
        // const_cast is fine, this is a non-const member function.
        iterator result = const_cast<iterator>(pos);

        std::ranges::move(result + 1, end(), result);
        pop_back();
        return result;
    }